

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

void xmlSchemaSAXHandleStartElementNs
               (void *ctx,xmlChar *localname,xmlChar *prefix,xmlChar *URI,int nb_namespaces,
               xmlChar **namespaces,int nb_attributes,int nb_defaulted,xmlChar **attributes)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  void *pvVar4;
  xmlChar *pxVar5;
  char *message;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  xmlChar xVar9;
  undefined4 in_register_00000084;
  xmlChar *pxVar10;
  uint uVar11;
  ulong uVar12;
  xmlChar **ppxVar13;
  long lVar14;
  int iVar15;
  xmlChar *in_stack_ffffffffffffffb8;
  xmlSchemaValidCtxtPtr pxVar16;
  
  pxVar10 = (xmlChar *)CONCAT44(in_register_00000084,nb_namespaces);
  iVar3 = *(int *)((long)ctx + 0xac) + 1;
  *(int *)((long)ctx + 0xac) = iVar3;
  if (*(int *)((long)ctx + 0x130) <= iVar3 && *(int *)((long)ctx + 0x130) != -1) {
    return;
  }
  iVar3 = xmlSchemaValidatorPushElem((xmlSchemaValidCtxtPtr)ctx);
  if (iVar3 == -1) {
    message = "calling xmlSchemaValidatorPushElem()";
    pxVar16 = (xmlSchemaValidCtxtPtr)ctx;
  }
  else {
    lVar1 = *(long *)((long)ctx + 0xc0);
    iVar3 = xmlSAX2GetLineNumber(*(void **)((long)ctx + 0x50));
    *(int *)(lVar1 + 0x10) = iVar3;
    *(xmlChar **)(lVar1 + 0x18) = localname;
    *(xmlChar **)(lVar1 + 0x20) = URI;
    *(byte *)(lVar1 + 0x40) = *(byte *)(lVar1 + 0x40) | 0x20;
    if (0 < nb_namespaces) {
      ppxVar13 = namespaces + 1;
      do {
        iVar3 = *(int *)(lVar1 + 0x84);
        if (iVar3 <= *(int *)(lVar1 + 0x80)) {
          if (iVar3 < 1) {
            uVar12 = 5;
          }
          else {
            uVar12 = 0xffffffff;
            if (iVar3 < 1000000000) {
              uVar11 = iVar3 + 1U >> 1;
              uVar6 = uVar11 + iVar3;
              if ((int)(1000000000 - uVar11) < iVar3) {
                uVar6 = 1000000000;
              }
              uVar12 = (ulong)uVar6;
            }
          }
          if (((int)uVar12 < 0) ||
             (pvVar4 = (*xmlRealloc)(*(void **)(lVar1 + 0x78),uVar12 << 4), pvVar4 == (void *)0x0))
          {
            xmlSchemaVErrMemory((xmlSchemaValidCtxtPtr)ctx);
            goto LAB_00192146;
          }
          *(void **)(lVar1 + 0x78) = pvVar4;
          *(int *)(lVar1 + 0x84) = (int)uVar12;
        }
        iVar3 = *(int *)(lVar1 + 0x80);
        *(xmlChar **)(*(long *)(lVar1 + 0x78) + (long)iVar3 * 0x10) = ppxVar13[-1];
        pxVar5 = *ppxVar13;
        if (**ppxVar13 == '\0') {
          pxVar5 = (xmlChar *)0x0;
        }
        *(xmlChar **)(*(long *)(lVar1 + 0x78) + (long)(iVar3 * 2 + 1) * 8) = pxVar5;
        *(int *)(lVar1 + 0x80) = iVar3 + 1;
        ppxVar13 = ppxVar13 + 2;
        nb_namespaces = nb_namespaces + -1;
      } while (nb_namespaces != 0);
    }
    if ((nb_attributes != 0) && (bVar2 = 0 < nb_attributes, 0 < nb_attributes)) {
      lVar14 = 0;
      iVar3 = 0;
      do {
        iVar15 = *(int *)(attributes + lVar14 + 4) - *(int *)(attributes + lVar14 + 3);
        pvVar4 = (*xmlMalloc)((long)(iVar15 + 1));
        if (pvVar4 == (void *)0x0) {
          xmlSchemaVErrMemory((xmlSchemaValidCtxtPtr)ctx);
LAB_00192107:
          if (bVar2) goto LAB_00192146;
          break;
        }
        if (iVar15 < 1) {
          uVar12 = 0;
        }
        else {
          uVar12 = 0;
          uVar7 = 0;
          do {
            if (((((int)uVar7 < iVar15 + -4) &&
                 (pxVar10 = attributes[lVar14 + 3], pxVar10[uVar7] == '&')) &&
                (pxVar10[uVar7 + 1] == '#')) &&
               (((pxVar10[uVar7 + 2] == '3' && (pxVar10[uVar7 + 3] == '8')) &&
                (pxVar10[uVar7 + 4] == ';')))) {
              iVar8 = 5;
              xVar9 = '&';
            }
            else {
              xVar9 = attributes[lVar14 + 3][uVar7];
              iVar8 = 1;
            }
            *(xmlChar *)((long)pvVar4 + uVar12) = xVar9;
            uVar6 = (int)uVar7 + iVar8;
            uVar7 = (ulong)uVar6;
            uVar12 = uVar12 + 1;
          } while ((int)uVar6 < iVar15);
          uVar12 = uVar12 & 0xffffffff;
        }
        *(undefined1 *)((long)pvVar4 + uVar12) = 0;
        pxVar10 = attributes[lVar14 + 2];
        iVar15 = xmlSchemaValidatorPushAttribute
                           ((xmlSchemaValidCtxtPtr)ctx,(xmlNodePtr)0x0,*(int *)(lVar1 + 0x10),
                            attributes[lVar14],pxVar10,(int)pvVar4,in_stack_ffffffffffffffb8,
                            (int)ctx);
        if (iVar15 == -1) {
          xmlSchemaInternalErr2
                    ((xmlSchemaAbstractCtxtPtr)ctx,"xmlSchemaSAXHandleStartElementNs",
                     "calling xmlSchemaValidatorPushAttribute()",(xmlChar *)0x0,pxVar10);
          goto LAB_00192107;
        }
        iVar3 = iVar3 + 1;
        lVar14 = lVar14 + 5;
        bVar2 = iVar3 < nb_attributes;
      } while (iVar3 != nb_attributes);
    }
    pxVar16 = (xmlSchemaValidCtxtPtr)ctx;
    iVar3 = xmlSchemaValidateElem((xmlSchemaValidCtxtPtr)ctx);
    if (iVar3 != -1) {
      return;
    }
    message = "calling xmlSchemaValidateElem()";
  }
  xmlSchemaInternalErr2
            ((xmlSchemaAbstractCtxtPtr)ctx,"xmlSchemaSAXHandleStartElementNs",message,(xmlChar *)0x0
             ,pxVar10);
  ctx = pxVar16;
LAB_00192146:
  ((xmlSchemaValidCtxtPtr)ctx)->err = -1;
  xmlStopParser(((xmlSchemaValidCtxtPtr)ctx)->parserCtxt);
  return;
}

Assistant:

static void
xmlSchemaSAXHandleStartElementNs(void *ctx,
				 const xmlChar * localname,
				 const xmlChar * prefix ATTRIBUTE_UNUSED,
				 const xmlChar * URI,
				 int nb_namespaces,
				 const xmlChar ** namespaces,
				 int nb_attributes,
				 int nb_defaulted ATTRIBUTE_UNUSED,
				 const xmlChar ** attributes)
{
    xmlSchemaValidCtxtPtr vctxt = (xmlSchemaValidCtxtPtr) ctx;
    int ret;
    xmlSchemaNodeInfoPtr ielem;
    int i, j;

    /*
    * SAX VAL TODO: What to do with nb_defaulted?
    */
    /*
    * Skip elements if inside a "skip" wildcard or invalid.
    */
    vctxt->depth++;
    if ((vctxt->skipDepth != -1) && (vctxt->depth >= vctxt->skipDepth))
	return;
    /*
    * Push the element.
    */
    if (xmlSchemaValidatorPushElem(vctxt) == -1) {
	VERROR_INT("xmlSchemaSAXHandleStartElementNs",
	    "calling xmlSchemaValidatorPushElem()");
	goto internal_error;
    }
    ielem = vctxt->inode;
    /*
    * TODO: Is this OK?
    */
    ielem->nodeLine = xmlSAX2GetLineNumber(vctxt->parserCtxt);
    ielem->localName = localname;
    ielem->nsName = URI;
    ielem->flags |= XML_SCHEMA_ELEM_INFO_EMPTY;
    /*
    * Register namespaces on the elem info.
    */
    if (nb_namespaces != 0) {
	/*
	* Although the parser builds its own namespace list,
	* we have no access to it, so we'll use an own one.
	*/
        for (i = 0, j = 0; i < nb_namespaces; i++, j += 2) {
	    /*
	    * Store prefix and namespace name.
	    */
            if (ielem->sizeNsBindings <= ielem->nbNsBindings) {
                const xmlChar **tmp;
                size_t elemSize = 2 * sizeof(tmp[0]);
                int newSize;

                newSize = xmlGrowCapacity(ielem->sizeNsBindings, elemSize,
                                          5, XML_MAX_ITEMS);
                if (newSize < 0) {
                    xmlSchemaVErrMemory(vctxt);
                    goto internal_error;
                }
                tmp = xmlRealloc(ielem->nsBindings, newSize * elemSize);
                if (tmp == NULL) {
                    xmlSchemaVErrMemory(vctxt);
                    goto internal_error;
                }

                ielem->nsBindings = tmp;
                ielem->sizeNsBindings = newSize;
	    }

	    ielem->nsBindings[ielem->nbNsBindings * 2] = namespaces[j];
	    if (namespaces[j+1][0] == 0) {
		/*
		* Handle xmlns="".
		*/
		ielem->nsBindings[ielem->nbNsBindings * 2 + 1] = NULL;
	    } else
		ielem->nsBindings[ielem->nbNsBindings * 2 + 1] =
		    namespaces[j+1];
	    ielem->nbNsBindings++;
	}
    }
    /*
    * Register attributes.
    * SAX VAL TODO: We are not adding namespace declaration
    * attributes yet.
    */
    if (nb_attributes != 0) {
	int valueLen, k, l;
	xmlChar *value;

        for (j = 0, i = 0; i < nb_attributes; i++, j += 5) {
	    /*
	    * Duplicate the value, changing any &#38; to a literal ampersand.
	    *
	    * libxml2 differs from normal SAX here in that it escapes all ampersands
	    * as &#38; instead of delivering the raw converted string. Changing the
	    * behavior at this point would break applications that use this API, so
	    * we are forced to work around it.
	    */
	    valueLen = attributes[j+4] - attributes[j+3];
	    value = xmlMalloc(valueLen + 1);
	    if (value == NULL) {
		xmlSchemaVErrMemory(vctxt);
		goto internal_error;
	    }
	    for (k = 0, l = 0; k < valueLen; l++) {
		if (k < valueLen - 4 &&
		    attributes[j+3][k+0] == '&' &&
		    attributes[j+3][k+1] == '#' &&
		    attributes[j+3][k+2] == '3' &&
		    attributes[j+3][k+3] == '8' &&
		    attributes[j+3][k+4] == ';') {
		    value[l] = '&';
		    k += 5;
		} else {
		    value[l] = attributes[j+3][k];
		    k++;
		}
	    }
	    value[l] = '\0';
	    /*
	    * TODO: Set the node line.
	    */
	    ret = xmlSchemaValidatorPushAttribute(vctxt,
		NULL, ielem->nodeLine, attributes[j], attributes[j+2], 0,
		value, 1);
	    if (ret == -1) {
		VERROR_INT("xmlSchemaSAXHandleStartElementNs",
		    "calling xmlSchemaValidatorPushAttribute()");
		goto internal_error;
	    }
	}
    }
    /*
    * Validate the element.
    */
    ret = xmlSchemaValidateElem(vctxt);
    if (ret != 0) {
	if (ret == -1) {
	    VERROR_INT("xmlSchemaSAXHandleStartElementNs",
		"calling xmlSchemaValidateElem()");
	    goto internal_error;
	}
	goto exit;
    }

exit:
    return;
internal_error:
    vctxt->err = -1;
    xmlStopParser(vctxt->parserCtxt);
}